

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

bool __thiscall
icu_63::anon_unknown_0::MutableCodePointTrie::ensureHighStart(MutableCodePointTrie *this,UChar32 c)

{
  uint uVar1;
  int iVar2;
  uint32_t *__dest;
  uint32_t *newIndex;
  int local_20;
  int32_t iLimit;
  int32_t i;
  UChar32 c_local;
  MutableCodePointTrie *this_local;
  
  if (this->highStart <= c) {
    uVar1 = c + 0x200U & 0xfffffe00;
    local_20 = this->highStart >> 4;
    iVar2 = (int)uVar1 >> 4;
    if (this->indexCapacity < iVar2) {
      __dest = (uint32_t *)uprv_malloc_63(0x44000);
      if (__dest == (uint32_t *)0x0) {
        return false;
      }
      memcpy(__dest,this->index,(long)(local_20 << 2));
      uprv_free_63(this->index);
      this->index = __dest;
      this->indexCapacity = 0x11000;
    }
    do {
      this->flags[local_20] = '\0';
      this->index[local_20] = this->initialValue;
      local_20 = local_20 + 1;
    } while (local_20 < iVar2);
    this->highStart = uVar1;
  }
  return true;
}

Assistant:

bool MutableCodePointTrie::ensureHighStart(UChar32 c) {
    if (c >= highStart) {
        // Round up to a UCPTRIE_CP_PER_INDEX_2_ENTRY boundary to simplify compaction.
        c = (c + UCPTRIE_CP_PER_INDEX_2_ENTRY) & ~(UCPTRIE_CP_PER_INDEX_2_ENTRY - 1);
        int32_t i = highStart >> UCPTRIE_SHIFT_3;
        int32_t iLimit = c >> UCPTRIE_SHIFT_3;
        if (iLimit > indexCapacity) {
            uint32_t *newIndex = (uint32_t *)uprv_malloc(I_LIMIT * 4);
            if (newIndex == nullptr) { return false; }
            uprv_memcpy(newIndex, index, i * 4);
            uprv_free(index);
            index = newIndex;
            indexCapacity = I_LIMIT;
        }
        do {
            flags[i] = ALL_SAME;
            index[i] = initialValue;
        } while(++i < iLimit);
        highStart = c;
    }
    return true;
}